

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_cast.c
# Opt level: O2

int l2_cast_hex_str_to_int(char *s)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  int ans;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  l2_assert_func((long)s,L2_INTERNAL_ERROR_NULL_POINTER,"l2_cast_hex_str_to_int",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_cast.c"
                 ,0xb);
  sVar3 = strlen(s);
  iVar2 = (int)sVar3;
  iVar4 = 0;
  uVar5 = 0;
  while( true ) {
    iVar2 = iVar2 + -1;
    iVar7 = 0;
    if (0 < iVar2) {
      iVar7 = iVar2;
    }
    bVar1 = *s;
    if (bVar1 == 0) break;
    iVar6 = 1;
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      iVar6 = iVar6 << 3;
    }
    if ((byte)(bVar1 - 0x30) < 10) {
      uVar5 = (uint)(byte)(bVar1 - 0x30);
    }
    else if ((byte)(bVar1 + 0x9f) < 6) {
      uVar5 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      uVar5 = bVar1 - 0x37;
    }
    iVar4 = iVar4 + iVar6 * uVar5;
    s = (char *)((byte *)s + 1);
  }
  return iVar4;
}

Assistant:

int l2_cast_hex_str_to_int(const char *s) {
    l2_assert(s, L2_INTERNAL_ERROR_NULL_POINTER);
    const char *p;
    int ans = 0, n = strlen(s), digit = 0, factor;
    for (p = s; *p != '\0'; p++) {
        l2_pow(factor, 8, n - 1);
        if (*p >= '0' && *p <= '9') {
            digit = *p - '0';
        } else if (*p >= 'a' && *p <= 'f') {
            digit = *p - 'a' + 10;
        } else if (*p >= 'A' && *p <= 'F') {
            digit = *p - 'A' + 10;
        }
        ans += factor * digit;
        n -= 1;
    }
    return ans;
}